

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>::
FunctionMockerBase(FunctionMockerBase<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)> *this)

{
  UntypedFunctionMockerBase *in_RDI;
  FunctionMockerBase<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>
  *in_stack_ffffffffffffffd8;
  
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(in_RDI);
  in_RDI->_vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_0039ee18;
  MockSpec<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>::MockSpec
            ((MockSpec<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)> *)in_RDI,
             in_stack_ffffffffffffffd8);
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}